

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

void helper_dshilo_mips64el(target_ulong shift,target_ulong ac,CPUMIPSState_conflict5 *env)

{
  byte bVar1;
  ulong local_38;
  uint64_t tempA;
  uint64_t tempB;
  int8_t shift_t;
  CPUMIPSState_conflict5 *env_local;
  target_ulong ac_local;
  target_ulong shift_local;
  
  bVar1 = (char)(shift << 1) >> 1;
  tempA = (env->active_tc).HI[ac];
  local_38 = (env->active_tc).LO[ac];
  if (bVar1 != 0) {
    if ((char)bVar1 < '\0') {
      tempA = tempA << (-bVar1 & 0x3f) | local_38 >> (bVar1 + 0x40 & 0x3f);
      local_38 = local_38 << (-bVar1 & 0x3f);
    }
    else {
      local_38 = tempA << (0x40 - bVar1 & 0x3f) | local_38 >> (bVar1 & 0x3f);
      tempA = tempA >> (bVar1 & 0x3f);
    }
  }
  (env->active_tc).HI[ac] = tempA;
  (env->active_tc).LO[ac] = local_38;
  return;
}

Assistant:

void helper_dshilo(target_ulong shift, target_ulong ac, CPUMIPSState *env)
{
    int8_t shift_t;
    uint64_t tempB, tempA;

    shift_t = (int8_t)(shift << 1) >> 1;

    tempB = env->active_tc.HI[ac];
    tempA = env->active_tc.LO[ac];

    if (shift_t != 0) {
        if (shift_t >= 0) {
            tempA = (tempB << (64 - shift_t)) | (tempA >> shift_t);
            tempB = tempB >> shift_t;
        } else {
            shift_t = -shift_t;
            tempB = (tempB << shift_t) | (tempA >> (64 - shift_t));
            tempA = tempA << shift_t;
        }
    }

    env->active_tc.HI[ac] = tempB;
    env->active_tc.LO[ac] = tempA;
}